

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntryFindIndex(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  Var pvVar7;
  int in_stack_00000010;
  undefined1 local_58 [8];
  ArgumentReader args;
  int64 length;
  CallInfo callInfo_local;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length = (int64)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2197,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8c363;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_58 = (undefined1  [8])length;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_58,(CallInfo *)&length);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pTVar2 = pSVar1->threadContext;
  bVar4 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if ((length & 0x1000000U) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x219b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
LAB_00b8c363:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if (((ulong)local_58 & 0xffffff) != 0) {
    callInfo_local = (CallInfo)0x0;
    pArr = (JavascriptArray *)0x0;
    pTVar2->noJsReentrancy = bVar4;
    pvVar7 = Arguments::operator[]((Arguments *)local_58,0);
    TryGetArrayAndLength<long>
              (pvVar7,pSVar1,L"Array.prototype.findIndex",(JavascriptArray **)&callInfo_local,
               (RecyclableObject **)&pArr,(long *)&args.super_Arguments.Values);
    pvVar7 = FindHelper<true,false>
                       ((JavascriptArray *)callInfo_local,(TypedArrayBase *)0x0,
                        (RecyclableObject *)pArr,(int64)args.super_Arguments.Values,
                        (Arguments *)local_58,pSVar1);
    pTVar2->noJsReentrancy = bVar4;
    return pvVar7;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.findIndex");
}

Assistant:

Var JavascriptArray::EntryFindIndex(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.findIndex"));
        }

        int64 length;
        JavascriptArray * pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT_UNLOCK(jsReentLock,
            TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.findIndex"), &pArr, &obj, &length));
            return JavascriptArray::FindHelper<true, false>(pArr, nullptr, obj, length, args, scriptContext);
    }